

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::BinaryExpr<const_int_&,_const_int_&>::streamReconstructedExpression
          (BinaryExpr<const_int_&,_const_int_&> *this,ostream *os)

{
  int in_EDX;
  int value;
  StringRef local_68;
  string local_50;
  string local_30;
  
  StringMaker<int,void>::convert_abi_cxx11_
            (&local_30,(StringMaker<int,void> *)(ulong)(uint)*this->m_lhs,in_EDX);
  local_68.m_start = (this->m_op).m_start;
  local_68.m_size = (this->m_op).m_size;
  local_68.m_data = (char *)0x0;
  StringMaker<int,void>::convert_abi_cxx11_
            (&local_50,(StringMaker<int,void> *)(ulong)(uint)*this->m_rhs,value);
  formatReconstructedExpression((ostream *)os,&local_30,&local_68,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_68.m_data != (char *)0x0) {
    operator_delete__(local_68.m_data);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

void streamReconstructedExpression( std::ostream &os ) const override {
            formatReconstructedExpression
                    ( os, Catch::Detail::stringify( m_lhs ), m_op, Catch::Detail::stringify( m_rhs ) );
        }